

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sineWaveTemporalCoding.cpp
# Opt level: O0

int main(void)

{
  time_t tVar1;
  ANN *pAVar2;
  Scalar *pSVar3;
  ArtificialPopulation *this;
  char *__s;
  TemporalPhaseDecodingSynapse *this_00;
  Population *n_to;
  TemporalPhaseDecodingSynapse_param *param;
  TemporalPhaseDecodingSynapse_param *this_01;
  Network *this_02;
  Synapse *n_synapse;
  Network n;
  Network_param *n_param;
  TemporalPhaseDecodingSynapse *s2;
  TemporalPhaseDecodingSynapse_param *params2;
  TemporalPhaseEncodingSynapse *s1;
  TemporalPhaseEncodingSynapse_param *params1;
  Population *p3;
  ArtificialPopulation *p2;
  Population *p1;
  SignalGenerator_param *paramp1;
  MatrixXd b;
  MatrixXd w;
  ANN *ann;
  MatrixXd *in_stack_fffffffffffffdc8;
  Dense *in_stack_fffffffffffffdd0;
  int *in_stack_fffffffffffffde0;
  int *in_stack_fffffffffffffde8;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *in_stack_fffffffffffffdf0;
  Population *n_from;
  allocator<char> *in_stack_fffffffffffffe00;
  char *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_03;
  string *in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe8c;
  ANN *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  int amount;
  Population *in_stack_fffffffffffffec0;
  allocator<char> local_121;
  string local_120 [8];
  Parameters *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffefc;
  Population *in_stack_ffffffffffffff00;
  undefined1 local_e9 [33];
  ANN *local_c8;
  ArtificialPopulation *local_c0;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_68;
  undefined4 local_64;
  allocator<char> local_41;
  string local_40 [48];
  ANN *local_10;
  int local_4;
  
  amount = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  local_4 = 0;
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  pAVar2 = (ANN *)operator_new(0x40);
  ANN::ANN((ANN *)in_stack_fffffffffffffdd0);
  local_10 = pAVar2;
  ANN::setInputSize(pAVar2,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  ANN::addLayer(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  local_64 = 1;
  local_68 = 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffdf0,(Index)in_stack_fffffffffffffde8,
                      (Index)in_stack_fffffffffffffde0);
  *pSVar3 = 0.1;
  local_84 = 1;
  local_88 = 1;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     (in_stack_fffffffffffffdf0,(Index)in_stack_fffffffffffffde8,
                      (Index)in_stack_fffffffffffffde0);
  *pSVar3 = 0.0;
  ANN::getLayer((ANN *)in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffdd0,
             in_stack_fffffffffffffdc8);
  Dense::setWeights(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x147c6e);
  ANN::getLayer((ANN *)in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20));
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffffdd0,
             in_stack_fffffffffffffdc8);
  Dense::setBiases(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x147cbc);
  this = (ArtificialPopulation *)operator_new(0x58);
  (this->super_Population).neurons.super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Population).current_time = 0.0;
  (this->super_Population).neurons.super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Population).neurons.super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(double *)&(this->super_Population).numberOfNeurons = 0.0;
  *(double *)&(this->super_Population).numberOfOutputNeurons = 0.0;
  (this->super_Population).output.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Population).output.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Population)._vptr_Population = (_func_int **)0x0;
  (this->super_Population).output.super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Population).clock = (Clock *)0x0;
  SignalGenerator_param::SignalGenerator_param((SignalGenerator_param *)this);
  (this->super_Population)._vptr_Population = (_func_int **)0x3fb999999999999a;
  local_c0 = this;
  pAVar2 = (ANN *)operator_new(0x60);
  this_03 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_03,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  Population::Population
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8);
  std::__cxx11::string::~string((string *)(local_e9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e9);
  local_c8 = pAVar2;
  __s = (char *)operator_new(0x98);
  ArtificialPopulation::ArtificialPopulation(this,pAVar2);
  this_00 = (TemporalPhaseDecodingSynapse *)operator_new(0x60);
  n_from = (Population *)&local_121;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_03,__s,(allocator<char> *)this_00);
  Population::Population(in_stack_fffffffffffffec0,amount,in_stack_fffffffffffffeb0);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  n_to = (Population *)std::ostream::operator<<((ostream *)&std::cout,(long)this_00);
  std::ostream::operator<<((ostream *)n_to,std::endl<char,std::char_traits<char>>);
  param = (TemporalPhaseDecodingSynapse_param *)operator_new(0x18);
  *(undefined8 *)param = 0;
  param->som_phase = 0.0;
  param->window_length_s = 0.0;
  TemporalPhaseEncodingSynapse_param::TemporalPhaseEncodingSynapse_param
            ((TemporalPhaseEncodingSynapse_param *)param);
  param->window_length_s = 0.1;
  param->som_frequency = 800;
  operator_new(0x78);
  TemporalPhaseEncodingSynapse::TemporalPhaseEncodingSynapse
            ((TemporalPhaseEncodingSynapse *)this_00,n_from,n_to,
             (TemporalPhaseEncodingSynapse_param *)param);
  this_01 = (TemporalPhaseDecodingSynapse_param *)operator_new(0x20);
  this_01->window_length_s = 0.0;
  this_01->delay_s = 0.0;
  *(undefined8 *)this_01 = 0;
  this_01->som_phase = 0.0;
  TemporalPhaseDecodingSynapse_param::TemporalPhaseDecodingSynapse_param(this_01);
  this_01->window_length_s = 0.1;
  this_01->som_frequency = 800;
  this_02 = (Network *)operator_new(0x78);
  TemporalPhaseDecodingSynapse::TemporalPhaseDecodingSynapse(this_00,n_from,n_to,param);
  n_synapse = (Synapse *)operator_new(8);
  n_synapse->_vptr_Synapse = (_func_int **)0x0;
  Network_param::Network_param((Network_param *)n_synapse);
  n_synapse->_vptr_Synapse = (_func_int **)0x3f50624dd2f1a9fc;
  Network::Network((Network *)this_00,(Network_param *)n_from);
  Network::add(this_02,n_synapse);
  Network::add(this_02,n_synapse);
  Network::run((Network *)this_00,(double)n_from);
  local_4 = 0;
  Network::~Network(this_02);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x148091);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x14809e);
  return local_4;
}

Assistant:

int main() 
{
    srand(time(NULL));

    ANN* ann = new ANN();
    ann->setInputSize(1);
    ann->addLayer(1, "tanh");

    Eigen::MatrixXd w = Eigen::MatrixXd(1, 1);
    w(0,0) = 0.1;
    Eigen::MatrixXd b = Eigen::MatrixXd(1, 1);
    b(0,0) = 0.0;
    static_cast<Dense*>(ann->getLayer(0))->setWeights(w);
    static_cast<Dense*>(ann->getLayer(0))->setBiases(b);

    // Populations
    SignalGenerator_param* paramp1 = new SignalGenerator_param();
    paramp1->f1 = 0.1;
    Population* p1 = new Population(1, "SignalGenerator", paramp1);

    ArtificialPopulation* p2 = new ArtificialPopulation(ann);

    Population* p3 = new Population(1, "PassThrough");
    cout << (long)p3 << endl;

    // Synapses
    TemporalPhaseEncodingSynapse_param* params1 = new TemporalPhaseEncodingSynapse_param();
    params1->window_length_s = 0.1;
    params1->som_frequency = 800;
    // params1->som_phase = M_PI / 2.0;
    TemporalPhaseEncodingSynapse* s1 = new TemporalPhaseEncodingSynapse(p1, p3, params1);

    TemporalPhaseDecodingSynapse_param* params2 = new TemporalPhaseDecodingSynapse_param();
    params2->window_length_s = 0.1;
    params2->som_frequency = 800;
    // params2->som_phase = M_PI / 2.0;
    TemporalPhaseDecodingSynapse* s2 = new TemporalPhaseDecodingSynapse(p3, p2, params2);

    // Create the network

    Network_param* n_param = new Network_param();
    n_param->dt = 0.001;
    Network n = Network(n_param);

    // Add the synapse to the network
    n.add(s1);
    n.add(s2);

    // Run the network for 100 second
    n.run(50.0);
    
    return 0;
}